

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsMPSolve(void *arkode_mem,N_Vector r,N_Vector z,sunrealtype tol,int lr)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  void *in_XMM0_Qa;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem *in_stack_ffffffffffffffc0;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  local_4 = arkLs_AccessARKODEMassMem
                      (in_XMM0_Qa,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (local_4 == 0) {
    local_4 = (*(code *)in_stack_ffffffffffffffc0[0x16])
                        (in_stack_ffffffffffffffc8[0x5a],in_XMM0_Qa,in_RSI,in_RDX,in_ECX,
                         in_stack_ffffffffffffffc0[0x18]);
    in_stack_ffffffffffffffc0[0x10] =
         (ARKLsMassMem)((long)&in_stack_ffffffffffffffc0[0x10]->iterative + 1);
  }
  return local_4;
}

Assistant:

int arkLsMPSolve(void* arkode_mem, N_Vector r, N_Vector z, sunrealtype tol, int lr)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* access ARKodeMem and ARKLsMassMem structures */
  retval = arkLs_AccessARKODEMassMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* call the user-supplied psolve routine, and accumulate count */
  retval = arkls_mem->psolve(ark_mem->tcur, r, z, tol, lr, arkls_mem->P_data);
  arkls_mem->nps++;
  return (retval);
}